

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_traverse_index(fdb_kvs_handle *handle,void *key,size_t keylen,fdb_index_traversal_callback cb,
                  void *ctx)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  reference pvVar6;
  bool bVar7;
  hbtrie_result hVar8;
  fdb_status fVar9;
  long lVar10;
  ulong *puVar11;
  undefined8 *puVar12;
  long *in_FS_OFFSET;
  undefined8 uStackY_190;
  undefined1 local_188 [6];
  docio_object *in_stack_fffffffffffffe80;
  allocator<char> *local_178;
  undefined8 uStack_170;
  size_t sStack_168;
  fdb_index_traversal_decision dec;
  size_t ptr_keylen;
  void *ptr;
  size_t ret_keylen;
  allocator<char> local_139 [9];
  hbtrie_iterator hit;
  int size_chunk;
  size_t doc_keylen;
  void *doc_key;
  fdb_txn *txn;
  fdb_status fs;
  hbtrie_result hr;
  docio_object _doc;
  uint64_t offset;
  void *ctx_local;
  fdb_index_traversal_callback cb_local;
  size_t keylen_local;
  void *key_local;
  fdb_kvs_handle *handle_local;
  
  uStackY_190 = 0x153c28;
  docio_object::docio_object(in_stack_fffffffffffffe80);
  pvVar6 = _local_188;
  if (handle == (fdb_kvs_handle *)0x0) {
    handle_local._4_4_ = FDB_RESULT_INVALID_HANDLE;
  }
  else if (((handle->config).do_not_search_wal & 1U) == 0) {
    handle_local._4_4_ = FDB_RESULT_INVALID_CONFIG;
  }
  else if (cb == (fdb_index_traversal_callback)0x0) {
    handle_local._4_4_ = FDB_RESULT_INVALID_ARGS;
  }
  else {
    uStackY_190 = 0x153c8c;
    uVar3 = (ulong)_local_188 >> 0x38;
    bVar7 = atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffe80,(uint8_t)uVar3,
                               (uint8_t)((ulong)pvVar6 >> 0x30));
    _local_188 = pvVar6;
    if (bVar7) {
      if (handle->shandle == (snap_handle *)0x0) {
        uStackY_190 = 0x153cb7;
        fdb_check_file_reopen(handle,(file_status_t *)0x0);
      }
      if (handle->shandle == (snap_handle *)0x0) {
        uStackY_190 = 0x153d12;
        fdb_sync_db_header((fdb_kvs_handle *)hit.trie.cmp_args.user_param);
      }
      puVar12 = (undefined8 *)local_188;
      if (((handle->kvs != (kvs_info *)0x0) &&
          (puVar12 = (undefined8 *)local_188, key != (void *)0x0)) &&
         (puVar12 = (undefined8 *)local_188, keylen != 0)) {
        hit._148_4_ = ZEXT24((handle->config).chunksize);
        lVar2 = -(keylen + (long)(int)hit._148_4_ + 0xf & 0xfffffffffffffff0);
        puVar12 = (undefined8 *)(local_188 + lVar2);
        *(undefined8 *)(local_188 + lVar2 + -8) = 0x153daa;
        kvid2buf(*(size_t *)((long)&uStack_170 + lVar2),*(fdb_kvs_id_t *)((long)&local_178 + lVar2),
                 *(void **)(&stack0xfffffffffffffe80 + lVar2));
        lVar10 = (long)(int)hit._148_4_;
        *(undefined8 *)(local_188 + lVar2 + -8) = 0x153dc8;
        memcpy((undefined1 *)((long)puVar12 + lVar10),key,keylen);
      }
      if ((char)in_FS_OFFSET[-0xb] == '\0') {
        local_178 = local_139;
        puVar12[-1] = 0x153de7;
        std::allocator<char>::allocator();
        puVar12[-1] = 0x153e08;
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)puVar12[5],puVar12[4],
                   (allocator_type *)puVar12[3]);
        puVar12[-1] = 0x153e16;
        std::allocator<char>::~allocator(local_139);
        lVar2 = *in_FS_OFFSET;
        puVar12[-1] = 0x153e39;
        __cxa_thread_atexit(std::vector<char,_std::allocator<char>_>::~vector,lVar2 + -0x70,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -0xb) = 1;
      }
      if ((char)in_FS_OFFSET[-7] == '\0') {
        puVar12[-1] = 0x153e61;
        std::allocator<char>::allocator();
        puVar12[-1] = 0x153e82;
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)puVar12[5],puVar12[4],
                   (allocator_type *)puVar12[3]);
        puVar12[-1] = 0x153e90;
        std::allocator<char>::~allocator((allocator<char> *)((long)&ret_keylen + 3));
        lVar2 = *in_FS_OFFSET;
        puVar12[-1] = 0x153eb3;
        __cxa_thread_atexit(std::vector<char,_std::allocator<char>_>::~vector,lVar2 + -0x50,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -7) = 1;
      }
      ptr = (void *)0x0;
      puVar12[-1] = 0x153ed0;
      _fdb_sync_dirty_root((fdb_kvs_handle *)puVar12[3]);
      puVar12[-1] = 0x153ef2;
      txn._4_4_ = hbtrie_iterator_init
                            ((hbtrie *)puVar12[2],(hbtrie_iterator *)puVar12[1],(void *)*puVar12,
                             puVar12[-1]);
      puVar12[-1] = 0x153efe;
      _fdb_release_dirty_root((fdb_kvs_handle *)puVar12[1]);
      while (txn._4_4_ == HBTRIE_RESULT_SUCCESS) {
        lVar2 = *in_FS_OFFSET;
        puVar12[-1] = 0x153f21;
        _local_188 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)(lVar2 + -0x70),0);
        lVar2 = *in_FS_OFFSET;
        puVar12[-1] = 0x153f41;
        std::vector<char,_std::allocator<char>_>::operator[]
                  ((vector<char,_std::allocator<char>_> *)(lVar2 + -0x50),0);
        puVar12[-1] = 0x153f5e;
        hVar8 = hbtrie_next_partial((hbtrie_iterator *)puVar12[6],(void *)puVar12[5],
                                    (size_t *)puVar12[4],(void *)puVar12[3]);
        puVar12[-1] = 0x153f6e;
        fVar9 = btreeblk_end((btreeblk_handle *)puVar12[2]);
        if ((fVar9 != FDB_RESULT_SUCCESS) || (hVar8 != HBTRIE_RESULT_SUCCESS)) break;
        ptr_keylen = 0;
        sStack_168 = 0;
        if ((handle->kvs != (kvs_info *)0x0) && ((void *)(ulong)(handle->config).chunksize <= ptr))
        {
          lVar2 = *in_FS_OFFSET;
          uVar1 = (handle->config).chunksize;
          puVar12[-1] = 0x15401c;
          ptr_keylen = (size_t)std::vector<char,_std::allocator<char>_>::operator[]
                                         ((vector<char,_std::allocator<char>_> *)(lVar2 + -0x70),
                                          (ulong)uVar1);
          sStack_168 = (long)ptr - (ulong)(handle->config).chunksize;
        }
        lVar2 = *in_FS_OFFSET;
        puVar12[-1] = 0x154055;
        puVar11 = (ulong *)std::vector<char,_std::allocator<char>_>::operator[]
                                     ((vector<char,_std::allocator<char>_> *)(lVar2 + -0x50),0);
        sVar5 = ptr_keylen;
        sVar4 = sStack_168;
        uVar3 = *puVar11;
        puVar12[-1] = 0x15411c;
        uStack_170._4_4_ =
             (*cb)(handle,(void *)sVar5,sVar4,
                   uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                   (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                   (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                   | uVar3 << 0x38,ctx);
        if (uStack_170._4_4_ == 1) break;
        txn._4_4_ = HBTRIE_RESULT_SUCCESS;
      }
      puVar12[-1] = 0x15413e;
      hbtrie_iterator_free((hbtrie_iterator *)puVar12[1]);
      puVar12[-1] = 0x154155;
      atomic_cas_uint8_t((atomic<unsigned_char> *)puVar12[1],*(uint8_t *)((long)puVar12 + 7),
                         *(uint8_t *)((long)puVar12 + 6));
      handle_local._4_4_ = FDB_RESULT_SUCCESS;
    }
    else {
      handle_local._4_4_ = FDB_RESULT_HANDLE_BUSY;
    }
  }
  return handle_local._4_4_;
}

Assistant:

LIBFDB_API
fdb_status fdb_traverse_index(fdb_kvs_handle *handle,
                              const void *key,
                              size_t keylen,
                              fdb_index_traversal_callback cb,
                              void* ctx)
{
    uint64_t offset;
    struct docio_object _doc;
    hbtrie_result hr = HBTRIE_RESULT_FAIL;
    fdb_status fs = FDB_RESULT_SUCCESS;
    fdb_txn *txn;
    //fdb_doc doc_kv;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!handle->config.do_not_search_wal) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!cb) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);
        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    // Need to prepend 8-byte ID in multi-KVS mode.
    void* doc_key = (void*)key;
    size_t doc_keylen = keylen;

    if (handle->kvs && key && keylen) {
        // multi KV instance mode
        int size_chunk = handle->config.chunksize;
        doc_keylen = keylen + size_chunk;
        doc_key = alca(uint8_t, doc_keylen);
        kvid2buf(size_chunk, handle->kvs->id, doc_key);
        memcpy((uint8_t*)doc_key + size_chunk, key, keylen);
    }

    struct hbtrie_iterator hit;

    thread_local std::vector<char> ret_key_buf(FDB_MAX_KEYLEN_INTERNAL);
    thread_local std::vector<char> ret_value_buf(64);
    size_t ret_keylen = 0;

    _fdb_sync_dirty_root(handle);
    hr = hbtrie_iterator_init(handle->trie, &hit, doc_key, doc_keylen);
    _fdb_release_dirty_root(handle);

    while (hr == HBTRIE_RESULT_SUCCESS) {
        hr = hbtrie_next_partial(&hit, &ret_key_buf[0], &ret_keylen, &ret_value_buf[0]);
        fs = btreeblk_end(handle->bhandle);
        if (fs != FDB_RESULT_SUCCESS || hr != HBTRIE_RESULT_SUCCESS) {
            break;
        }

        void* ptr = nullptr;
        size_t ptr_keylen = 0;
        if (handle->kvs && ret_keylen >= handle->config.chunksize) {
            // In multi-KVS mode, skip the first 8-byte (KVS ID)
            // as it is not the part of user-key.
            ptr = &ret_key_buf[handle->config.chunksize];
            ptr_keylen = ret_keylen - handle->config.chunksize;
        }

        offset = *((uint64_t*)&ret_value_buf[0]);
        offset = _endian_decode(offset);

        fdb_index_traversal_decision dec =
            cb(handle, ptr, ptr_keylen, offset, ctx);
        if (dec == FDB_IT_STOP) {
            break;
        }
    }
    hbtrie_iterator_free(&hit);

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;;
}